

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::bit<(moira::Core)0,(moira::Instr)31>(Moira *this,u32 op,u8 bit)

{
  u8 bit_local;
  u32 op_local;
  Moira *this_local;
  
  (this->reg).sr.z = (op >> (bit & 0x1f) & 1) != 1;
  return op;
}

Assistant:

u32
Moira::bit(u32 op, u8 bit)
{
    switch (I) {

        case Instr::BCHG:

            reg.sr.z = 1 ^ ((op >> bit) & 1);
            op ^= (1 << bit);
            break;

        case Instr::BSET:

            reg.sr.z = 1 ^ ((op >> bit) & 1);
            op |= (1 << bit);
            break;

        case Instr::BCLR:

            reg.sr.z = 1 ^ ((op >> bit) & 1);
            op &= ~(1 << bit);
            break;

        case Instr::BTST:

            reg.sr.z = 1 ^ ((op >> bit) & 1);
            break;

        default:
            fatalError;
    }
    return op;
}